

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O0

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTupleArray<long,3ul>
          (AsciiParser *this,
          vector<nonstd::optional_lite::optional<std::array<long,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_3UL>_>_>_>
          *result)

{
  bool bVar1;
  char local_21;
  vector<nonstd::optional_lite::optional<std::array<long,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_3UL>_>_>_>
  *pvStack_20;
  char c;
  vector<nonstd::optional_lite::optional<std::array<long,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_3UL>_>_>_>
  *result_local;
  AsciiParser *this_local;
  
  pvStack_20 = result;
  result_local = (vector<nonstd::optional_lite::optional<std::array<long,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_3UL>_>_>_>
                  *)this;
  bVar1 = Expect(this,'[');
  if (bVar1) {
    bVar1 = SkipCommentAndWhitespaceAndNewline(this,true);
    if (bVar1) {
      bVar1 = Char1(this,&local_21);
      if (bVar1) {
        if (local_21 == ']') {
          ::std::
          vector<nonstd::optional_lite::optional<std::array<long,_3UL>_>,_std::allocator<nonstd::optional_lite::optional<std::array<long,_3UL>_>_>_>
          ::clear(pvStack_20);
          this_local._7_1_ = true;
        }
        else {
          Rewind(this,1);
          bVar1 = SepBy1TupleType<long,3ul>(this,',',pvStack_20);
          if (bVar1) {
            bVar1 = Expect(this,']');
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool AsciiParser::ParseTupleArray(
    std::vector<nonstd::optional<std::array<T, N>>> *result) {

  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1TupleType<T, N>(',', result)) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }

  return true;
}